

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void testing::anon_unknown_6::SetReactionOnUninterestingCalls
               (uintptr_t mock_obj,CallReaction reaction)

{
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  mapped_type *pmVar1;
  uintptr_t local_10;
  
  local_10 = mock_obj;
  internal::MutexBase::Lock((MutexBase *)internal::g_gmock_mutex);
  this = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)UninterestingCallReactionMap();
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_testing::internal::CallReaction>,_std::allocator<std::pair<const_unsigned_long,_testing::internal::CallReaction>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this,&local_10);
  *pmVar1 = reaction;
  internal::MutexBase::Unlock((MutexBase *)internal::g_gmock_mutex);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  UninterestingCallReactionMap()[mock_obj] = reaction;
}